

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeChangeP4(Vdbe *p,int addr,char *zP4,int n)

{
  Op *pOp_00;
  sqlite3 *db;
  Op *pOp;
  int n_local;
  char *zP4_local;
  int addr_local;
  Vdbe *p_local;
  
  if (p->db->mallocFailed == '\0') {
    zP4_local._4_4_ = addr;
    if (addr < 0) {
      zP4_local._4_4_ = p->nOp + -1;
    }
    pOp_00 = p->aOp + zP4_local._4_4_;
    if ((n < 0) && (pOp_00->p4type == '\0')) {
      if (n == -3) {
        (pOp_00->p4).i = (int)zP4;
        pOp_00->p4type = -3;
      }
      else if (zP4 != (char *)0x0) {
        (pOp_00->p4).z = zP4;
        pOp_00->p4type = (char)n;
        if (n == -0xc) {
          sqlite3VtabLock((VTable *)zP4);
        }
      }
    }
    else {
      vdbeChangeP4Full(p,pOp_00,zP4,n);
    }
  }
  else if (n != -0xc) {
    freeP4(p->db,n,zP4);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeChangeP4(Vdbe *p, int addr, const char *zP4, int n){
  Op *pOp;
  sqlite3 *db;
  assert( p!=0 );
  db = p->db;
  assert( p->magic==VDBE_MAGIC_INIT );
  assert( p->aOp!=0 || db->mallocFailed );
  if( db->mallocFailed ){
    if( n!=P4_VTAB ) freeP4(db, n, (void*)*(char**)&zP4);
    return;
  }
  assert( p->nOp>0 );
  assert( addr<p->nOp );
  if( addr<0 ){
    addr = p->nOp - 1;
  }
  pOp = &p->aOp[addr];
  if( n>=0 || pOp->p4type ){
    vdbeChangeP4Full(p, pOp, zP4, n);
    return;
  }
  if( n==P4_INT32 ){
    /* Note: this cast is safe, because the origin data point was an int
    ** that was cast to a (const char *). */
    pOp->p4.i = SQLITE_PTR_TO_INT(zP4);
    pOp->p4type = P4_INT32;
  }else if( zP4!=0 ){
    assert( n<0 );
    pOp->p4.p = (void*)zP4;
    pOp->p4type = (signed char)n;
    if( n==P4_VTAB ) sqlite3VtabLock((VTable*)zP4);
  }
}